

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O1

Own<capnp::SchemaLoader::Impl> __thiscall
kj::
heap<capnp::SchemaLoader::Impl,capnp::SchemaLoader&,capnp::SchemaLoader::LazyLoadCallback_const&>
          (kj *this,SchemaLoader *params,LazyLoadCallback *params_1)

{
  Arena *this_00;
  Impl *extraout_RDX;
  Own<capnp::SchemaLoader::Impl> OVar1;
  
  this_00 = (Arena *)operator_new(0x1b0);
  Arena::Arena(this_00,0x400);
  this_00[1].nextChunkSize = 0;
  this_00[1].chunkList = (ChunkHeader *)0x0;
  this_00[1].objectList = (ObjectHeader *)0x0;
  this_00[0xb].chunkList = (ChunkHeader *)0x0;
  this_00[0xb].objectList = (ObjectHeader *)0x0;
  this_00[0xb].currentChunk = (ChunkHeader *)0x0;
  this_00[0xc].nextChunkSize = 0;
  this_00[2].chunkList = (ChunkHeader *)0x0;
  this_00[2].objectList = (ObjectHeader *)0x0;
  this_00[2].currentChunk = (ChunkHeader *)0x0;
  this_00[3].nextChunkSize = 0;
  this_00[3].chunkList = (ChunkHeader *)0x0;
  this_00[3].objectList = (ObjectHeader *)0x0;
  this_00[3].currentChunk = (ChunkHeader *)0x0;
  this_00[4].objectList = (ObjectHeader *)0x0;
  this_00[4].currentChunk = (ChunkHeader *)0x0;
  this_00[5].nextChunkSize = 0;
  this_00[5].chunkList = (ChunkHeader *)0x0;
  this_00[5].objectList = (ObjectHeader *)0x0;
  this_00[5].currentChunk = (ChunkHeader *)0x0;
  this_00[6].nextChunkSize = 0;
  this_00[6].currentChunk = (ChunkHeader *)0x0;
  this_00[7].nextChunkSize = 0;
  this_00[7].chunkList = (ChunkHeader *)0x0;
  this_00[7].objectList = (ObjectHeader *)0x0;
  this_00[7].currentChunk = (ChunkHeader *)0x0;
  this_00[8].nextChunkSize = 0;
  this_00[8].chunkList = (ChunkHeader *)0x0;
  this_00[10].nextChunkSize = 0;
  this_00[10].chunkList = (ChunkHeader *)0x0;
  this_00[9].objectList = (ObjectHeader *)0x0;
  this_00[9].currentChunk = (ChunkHeader *)0x0;
  this_00[9].nextChunkSize = 0;
  this_00[9].chunkList = (ChunkHeader *)0x0;
  this_00[10].objectList = (ObjectHeader *)0x0;
  this_00[0xc].chunkList = (ChunkHeader *)&PTR_init_00287498;
  this_00[0xc].objectList = (ObjectHeader *)params;
  this_00[0xc].currentChunk = (ChunkHeader *)params_1;
  this_00[0xd].nextChunkSize = (size_t)&PTR_init_002874c8;
  this_00[0xd].chunkList = (ChunkHeader *)params;
  *(undefined8 **)this = &_::HeapDisposer<capnp::SchemaLoader::Impl>::instance;
  *(Arena **)(this + 8) = this_00;
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

Own<T> heap(Params&&... params) {
  // heap<T>(...) allocates a T on the heap, forwarding the parameters to its constructor.  The
  // exact heap implementation is unspecified -- for now it is operator new, but you should not
  // assume this.  (Since we know the object size at delete time, we could actually implement an
  // allocator that is more efficient than operator new.)

  return Own<T>(new T(kj::fwd<Params>(params)...), _::HeapDisposer<T>::instance);
}